

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.cpp
# Opt level: O2

void __thiscall libchars::command_cursor::rewind(command_cursor *this,FILE *__stream)

{
  undefined1 local_68 [8];
  command_node_stack_t empty;
  
  std::
  stack<libchars::command_node*,std::deque<libchars::command_node*,std::allocator<libchars::command_node*>>>
  ::stack<std::deque<libchars::command_node*,std::allocator<libchars::command_node*>>,void>
            ((stack<libchars::command_node_*,_std::deque<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>_>
              *)local_68);
  std::
  swap<std::_Deque_base<libchars::command_node*,std::allocator<libchars::command_node*>>::_Deque_impl_data>
            ((_Deque_impl_data *)this,(_Deque_impl_data *)local_68);
  (this->w)._M_string_length = 0;
  *(this->w)._M_dataplus._M_p = '\0';
  this->idx = 0;
  std::_Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>::
  ~_Deque_base((_Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_> *)
               local_68);
  return;
}

Assistant:

void command_cursor::rewind()
    {
        command_node_stack_t empty;
        std::swap(S,empty);
        w.clear();
        idx = 0;
    }